

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pig2vcd.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  ssize_t sVar3;
  char *pcVar4;
  gpioReport_t report;
  uint32_t changed;
  uint32_t lastLevel;
  uint32_t t0;
  int v;
  int r;
  int b;
  undefined1 local_34 [4];
  int local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  int local_20;
  uint local_1c;
  int local_18;
  uint local_14;
  undefined4 local_4;
  
  local_4 = 0;
  sVar3 = read(0,local_34,0xc);
  local_18 = (int)sVar3;
  if (local_18 == 0xc) {
    pcVar4 = timeStamp();
    printf("$date %s $end\n",pcVar4);
    printf("$version pig2vcd V1 $end\n");
    printf("$timescale 1 us $end\n");
    printf("$scope module top $end\n");
    for (local_14 = 0; (int)local_14 < 0x20; local_14 = local_14 + 1) {
      uVar1 = symbol(local_14);
      printf("$var wire 1 %c %d $end\n",(ulong)uVar1,(ulong)local_14);
    }
    printf("$upscope $end\n");
    printf("$enddefinitions $end\n");
    local_20 = local_30;
    local_24 = 0;
    while( true ) {
      sVar3 = read(0,local_34,0xc);
      local_18 = (int)sVar3;
      if (local_18 != 0xc) break;
      if (local_2c != local_24) {
        printf("#%u\n",(ulong)(uint)(local_30 - local_20));
        local_28 = local_2c ^ local_24;
        local_24 = local_2c;
        for (local_14 = 0; (int)local_14 < 0x20; local_14 = local_14 + 1) {
          if ((local_28 & 1 << ((byte)local_14 & 0x1f)) != 0) {
            if ((local_2c & 1 << ((byte)local_14 & 0x1f)) == 0) {
              local_1c = 0x30;
            }
            else {
              local_1c = 0x31;
            }
            uVar1 = local_1c;
            uVar2 = symbol(local_14);
            printf("%c%c\n",(ulong)uVar1,(ulong)uVar2);
          }
        }
      }
    }
    return 0;
  }
  exit(-1);
}

Assistant:

int main(int argc, char * argv[])
{
   int b, r, v;
   uint32_t t0;
   uint32_t lastLevel, changed;

   gpioReport_t report;

   r=read(STDIN_FILENO, &report, RS);

   if (r != RS) exit(-1);

   printf("$date %s $end\n", timeStamp());
   printf("$version pig2vcd V1 $end\n");
   printf("$timescale 1 us $end\n");
   printf("$scope module top $end\n");

   for (b=0; b<32; b++)
      printf("$var wire 1 %c %d $end\n", symbol(b), b);
        
   printf("$upscope $end\n");
   printf("$enddefinitions $end\n");
         
   t0 = report.tick;
   lastLevel =0;

   while ((r=read(STDIN_FILENO, &report, RS)) == RS)
   {
      if (report.level != lastLevel)
      {
         printf("#%u\n", report.tick - t0);

         changed = report.level ^ lastLevel;

         lastLevel = report.level;

         for (b=0; b<32; b++)
         {
            if (changed & (1<<b))
            {
               if (report.level & (1<<b)) v='1'; else v='0';

               printf("%c%c\n", v, symbol(b));
            }
         }
      }
   }
   return 0;
}